

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Compressor::Impl::writePaletted
          (Impl *this,Image *image,
          unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
          *palette,bool separateAlpha)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  pointer pCVar2;
  mapped_type *pmVar3;
  __node_base *p_Var4;
  pointer pCVar5;
  mapped_type *pmVar6;
  unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
  *__range1;
  Color c;
  Color local_44;
  Image *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  this_00 = &this->palettedImageScratch;
  puVar1 = (this->palettedImageScratch).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->palettedImageScratch).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->palettedImageScratch).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(long)(((image->size).height * (image->size).width << (separateAlpha & 0x1fU))
                           + 0x400));
  puVar1 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  p_Var4 = &(palette->_M_h)._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    *(int *)(puVar1 + (ulong)(byte)*(undefined1 *)((long)(p_Var4 + 1) + 4) * 4) =
         (int)*(size_type *)(p_Var4 + 1);
  }
  pmVar6 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 0x400;
  pCVar2 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40 = image;
  local_38 = this_00;
  for (pCVar5 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar5 != pCVar2; pCVar5 = pCVar5 + 1) {
    local_44 = *pCVar5;
    if (separateAlpha) {
      local_44 = (Color)((uint)local_44 & 0xffffff);
    }
    pmVar3 = std::__detail::
             _Map_base<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<Color,_std::pair<const_Color,_unsigned_char>,_std::allocator<std::pair<const_Color,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<Color>,_std::hash<Color>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)palette,&local_44);
    *pmVar6 = *pmVar3;
    pmVar6 = pmVar6 + 1;
  }
  if (separateAlpha) {
    pCVar2 = (local_40->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar5 = (local_40->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar5 != pCVar2; pCVar5 = pCVar5 + 1) {
      *pmVar6 = pCVar5->a;
      pmVar6 = pmVar6 + 1;
    }
  }
  return local_38;
}

Assistant:

std::vector<uint8_t>& writePaletted(const Image& image, const std::unordered_map<Color, uint8_t>& palette, bool separateAlpha) {
		palettedImageScratch.clear();
		palettedImageScratch.resize(1024 + image.size.area() * (separateAlpha ? 2 : 1));
		Color* palData = reinterpret_cast<Color*>(palettedImageScratch.data());
		for (auto& pair : palette) {
			palData[pair.second] = pair.first;
		}
		uint8_t* ptr = palettedImageScratch.data() + 1024;
		for (Color c : image.colorData) {
			if (separateAlpha) {
				c.a = 0;
			}
			*ptr = palette.at(c);
			ptr++;
		}
		if (separateAlpha) {
			for (Color c : image.colorData) {
				*ptr = c.a;
				ptr++;
			}
		}

		return palettedImageScratch;
	}